

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O0

int CVodeSetQuadErrCon(void *cvode_mem,int errconQ)

{
  undefined4 in_ESI;
  long in_RDI;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x405,"CVodeSetQuadErrCon",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    *(undefined4 *)(in_RDI + 0x68) = in_ESI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeSetQuadErrCon(void* cvode_mem, sunbooleantype errconQ)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  cv_mem->cv_errconQ = errconQ;

  return (CV_SUCCESS);
}